

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_write_uvector(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  byte bVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  undefined1 x [16];
  undefined1 x_00 [16];
  ulong uVar5;
  sexp psVar6;
  sexp extraout_RDX;
  sexp extraout_RDX_00;
  sexp psVar7;
  undefined1 *extraout_RDX_01;
  undefined1 *extraout_RDX_02;
  undefined1 *extraout_RDX_03;
  undefined1 *extraout_RDX_04;
  undefined1 *extraout_RDX_05;
  sexp extraout_RDX_06;
  undefined1 *extraout_RDX_07;
  sexp extraout_RDX_08;
  undefined1 *extraout_RDX_09;
  undefined1 *extraout_RDX_10;
  undefined1 *extraout_RDX_11;
  undefined1 *n_00;
  sexp extraout_RDX_12;
  sexp extraout_RDX_13;
  sexp extraout_RDX_14;
  sexp extraout_RDX_15;
  undefined1 *extraout_RDX_16;
  undefined1 *extraout_RDX_17;
  long lVar8;
  double dVar9;
  sexp f;
  sexp tmp;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &f;
  f = (sexp)&DAT_0000043e;
  local_40.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_40.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  f = sexp_make_flonum(ctx,0.0);
  psVar2 = (out->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    putc(0x23,(FILE *)(out->value).type.getters);
  }
  else {
    psVar7 = (out->value).type.print;
    if (psVar7 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar7->tag + 1);
      *(undefined1 *)((long)&psVar7->tag + (long)&psVar2->tag) = 0x23;
    }
    else {
      sexp_buffered_write_char(ctx,0x23,out);
    }
  }
  psVar2 = (out->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    putc((uint)"#ususususuffccff"[(obj->value).uvector.element_type],
         (FILE *)(out->value).type.getters);
    psVar7 = extraout_RDX;
  }
  else {
    psVar7 = (out->value).type.print;
    bVar1 = "#ususususuffccff"[(obj->value).uvector.element_type];
    if (psVar7 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar7->tag + 1);
      *(byte *)((long)&psVar7->tag + (long)&psVar2->tag) = bVar1;
    }
    else {
      sexp_buffered_write_char(ctx,(uint)bVar1,out);
      psVar7 = extraout_RDX_00;
    }
  }
  sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar7,
                (sexp)((ulong)""[(obj->value).uvector.element_type] * 2 + 1),out);
  psVar2 = (out->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    putc(0x28,(FILE *)(out->value).type.getters);
    n_00 = extraout_RDX_01;
  }
  else {
    psVar7 = (out->value).type.print;
    if (psVar7 < (sexp)(out->value).port.size) {
      n_00 = (undefined1 *)((long)&psVar7->tag + 1);
      (out->value).port.offset = (sexp_uint_t)n_00;
      *(undefined1 *)((long)&psVar7->tag + (long)&psVar2->tag) = 0x28;
    }
    else {
      sexp_buffered_write_char(ctx,0x28,out);
      n_00 = extraout_RDX_02;
    }
  }
  psVar2 = (obj->value).type.name;
  local_58 = (obj->value).type.slots;
  lVar8 = 0;
  psVar7 = (sexp)0x0;
  do {
    if (local_58 == psVar7) {
      psVar2 = (out->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        putc(0x29,(FILE *)(out->value).type.getters);
      }
      else {
        psVar7 = (out->value).type.print;
        if (psVar7 < (sexp)(out->value).port.size) {
          (out->value).type.print = (sexp)((long)&psVar7->tag + 1);
          *(undefined1 *)((long)&psVar7->tag + (long)&psVar2->tag) = 0x29;
        }
        else {
          sexp_buffered_write_char(ctx,0x29,out);
        }
      }
      (ctx->value).context.saves = local_50.next;
      return (sexp)&DAT_0000043e;
    }
    if (psVar7 != (sexp)0x0) {
      psVar6 = (out->value).type.setters;
      if (psVar6 == (sexp)0x0) {
        putc(0x20,(FILE *)(out->value).type.getters);
        n_00 = extraout_RDX_03;
      }
      else {
        uVar5 = (out->value).port.offset;
        if (uVar5 < (out->value).port.size) {
          n_00 = (undefined1 *)(uVar5 + 1);
          (out->value).port.offset = (sexp_uint_t)n_00;
          *(undefined1 *)((long)&psVar6->tag + uVar5) = 0x20;
        }
        else {
          sexp_buffered_write_char(ctx,0x20,out);
          n_00 = extraout_RDX_04;
        }
      }
    }
    switch((obj->value).flonum_bits[8]) {
    case '\x01':
      psVar6 = (sexp)(ulong)(((uint)(int)(((obj->value).type.name)->value).flonum_bits
                                         [((ulong)psVar7 >> 3) + 8] >> ((byte)psVar7 & 7) & 1) * 2 +
                            1);
      goto LAB_0010dbe3;
    case '\x02':
      uVar5 = (ulong)((psVar2->value).flonum_bits + 8)[(long)psVar7];
      goto LAB_0010db87;
    default:
      goto switchD_0010da51_caseD_3;
    case '\x04':
      uVar5 = (ulong)*(short *)((long)&psVar2->value + (long)psVar7 * 2 + 8);
      goto LAB_0010db87;
    case '\x05':
      uVar5 = (ulong)*(ushort *)((long)&psVar2->value + (long)psVar7 * 2 + 8);
LAB_0010db87:
      psVar6 = (sexp)(uVar5 * 2 + 1);
      goto LAB_0010dbe3;
    case '\x06':
      goto LAB_0010db9d;
    case '\a':
      goto LAB_0010dbac;
    case '\b':
LAB_0010db9d:
      x._8_8_ = tmp;
      x._0_8_ = f;
      tmp = sexp_make_integer(ctx,(sexp_lsint_t)x);
      psVar6 = tmp;
      n_00 = extraout_RDX_09;
      goto LAB_0010dbe3;
    case '\t':
LAB_0010dbac:
      x_00._8_8_ = tmp;
      x_00._0_8_ = f;
      tmp = sexp_make_unsigned_integer(ctx,(sexp_luint_t)x_00);
      psVar6 = tmp;
      n_00 = extraout_RDX_10;
      goto LAB_0010dbe3;
    case '\n':
      dVar9 = (double)*(float *)((long)&psVar2->value + (long)psVar7 * 4 + 8);
      break;
    case '\v':
      dVar9 = *(double *)((long)&psVar2->value + (long)psVar7 * 8 + 8);
      break;
    case '\f':
      (f->value).flonum = (double)*(float *)((long)&psVar2->value + (long)psVar7 * 8 + 8);
      sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,f,out);
      psVar6 = extraout_RDX_06;
      if (0.0 <= *(float *)((long)&psVar2->value + (long)psVar7 * 8 + 0xc)) {
        psVar3 = (out->value).type.setters;
        if (psVar3 == (sexp)0x0) {
          putc(0x2b,(FILE *)(out->value).type.getters);
          psVar6 = extraout_RDX_12;
        }
        else {
          psVar4 = (out->value).type.print;
          if (psVar4 < (sexp)(out->value).port.size) {
            psVar6 = (sexp)((long)&psVar4->tag + 1);
            (out->value).type.print = psVar6;
            *(undefined1 *)((long)&psVar4->tag + (long)&psVar3->tag) = 0x2b;
          }
          else {
            sexp_buffered_write_char(ctx,0x2b,out);
            psVar6 = extraout_RDX_14;
          }
        }
      }
      dVar9 = (double)*(float *)((long)&psVar2->value + (long)psVar7 * 8 + 0xc);
      goto LAB_0010dc3f;
    case '\r':
      (f->value).flonum = *(double *)((long)&psVar2->value + lVar8 + 8);
      sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,f,out);
      psVar6 = extraout_RDX_08;
      if (0.0 <= *(double *)((long)&psVar2->value + lVar8 + 0x10)) {
        psVar3 = (out->value).type.setters;
        if (psVar3 == (sexp)0x0) {
          putc(0x2b,(FILE *)(out->value).type.getters);
          psVar6 = extraout_RDX_13;
        }
        else {
          psVar4 = (out->value).type.print;
          if (psVar4 < (sexp)(out->value).port.size) {
            psVar6 = (sexp)((long)&psVar4->tag + 1);
            (out->value).type.print = psVar6;
            *(undefined1 *)((long)&psVar4->tag + (long)&psVar3->tag) = 0x2b;
          }
          else {
            sexp_buffered_write_char(ctx,0x2b,out);
            psVar6 = extraout_RDX_15;
          }
        }
      }
      dVar9 = *(double *)((long)&psVar2->value + lVar8 + 0x10);
LAB_0010dc3f:
      (f->value).flonum = dVar9;
      sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)psVar6,f,out);
      psVar6 = (out->value).type.setters;
      if (psVar6 == (sexp)0x0) {
        putc(0x69,(FILE *)(out->value).type.getters);
        n_00 = extraout_RDX_16;
      }
      else {
        psVar3 = (out->value).type.print;
        if (psVar3 < (sexp)(out->value).port.size) {
          n_00 = (undefined1 *)((long)&psVar3->tag + 1);
          (out->value).port.offset = (sexp_uint_t)n_00;
          *(undefined1 *)((long)&psVar3->tag + (long)&psVar6->tag) = 0x69;
        }
        else {
          sexp_buffered_write_char(ctx,0x69,out);
          n_00 = extraout_RDX_17;
        }
      }
      goto switchD_0010da51_caseD_3;
    case '\x0e':
      dVar9 = sexp_quarter_to_double((&(psVar2->value).uvector.element_type)[(long)psVar7]);
      n_00 = extraout_RDX_07;
      break;
    case '\x0f':
      dVar9 = sexp_half_to_double(*(unsigned_short *)((long)&psVar2->value + (long)psVar7 * 2 + 8));
      n_00 = extraout_RDX_05;
    }
    (f->value).flonum = dVar9;
    psVar6 = f;
LAB_0010dbe3:
    sexp_write_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,psVar6,out);
    n_00 = extraout_RDX_11;
switchD_0010da51_caseD_3:
    psVar7 = (sexp)((long)&psVar7->tag + 1);
    lVar8 = lVar8 + 0x10;
  } while( true );
}

Assistant:

sexp sexp_write_uvector(sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp_uint_t i, len;
  char* str;
  sexp_gc_var2(f, tmp);
  sexp_gc_preserve2(ctx, f, tmp);
  f = sexp_make_flonum(ctx, 0.0f);
  sexp_write_char(ctx, '#', out);
  sexp_write_char(ctx, sexp_uvector_prefix(sexp_uvector_type(obj)), out);
  sexp_write(ctx, sexp_make_fixnum(sexp_uvector_element_size(sexp_uvector_type(obj))), out);
  sexp_write_char(ctx, '(', out);
  len = sexp_uvector_length(obj);
  str = (char*) sexp_uvector_data(obj);
  for (i=0; i<(sexp_sint_t)len; i++) {
    if (i!=0) sexp_write_char(ctx, ' ', out);
    switch (sexp_uvector_type(obj)) {
    case SEXP_U1: sexp_write(ctx, sexp_make_fixnum(sexp_bit_ref(obj, i)), out); break;
    case SEXP_S8: sexp_write(ctx, sexp_make_fixnum(((signed char*)str)[i]), out); break;
    case SEXP_S16: sexp_write(ctx, sexp_make_fixnum(((signed short*)str)[i]), out); break;
    case SEXP_U16: sexp_write(ctx, sexp_make_fixnum(((unsigned short*)str)[i]), out); break;
    case SEXP_S32: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int32_t*)str)[i]), out); break;
    case SEXP_U32: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint32_t*)str)[i]), out); break;
    case SEXP_S64: sexp_write(ctx, tmp=sexp_make_integer(ctx, ((int64_t*)str)[i]), out); break;
    case SEXP_U64: sexp_write(ctx, tmp=sexp_make_unsigned_integer(ctx, ((uint64_t*)str)[i]), out); break;
#if SEXP_USE_FLONUMS
#if SEXP_USE_MINI_FLOAT_UNIFORM_VECTORS
    case SEXP_F8: sexp_flonum_value_set(f, sexp_quarter_to_double(((unsigned char*)str)[i])); sexp_write(ctx, f, out); break;
    case SEXP_F16: sexp_flonum_value_set(f, sexp_half_to_double(((unsigned short*)str)[i])); sexp_write(ctx, f, out); break;
#endif
    case SEXP_F32: sexp_flonum_value_set(f, ((float*)str)[i]); sexp_write(ctx, f, out); break;
    case SEXP_F64: sexp_flonum_value_set(f, ((double*)str)[i]); sexp_write(ctx, f, out); break;
#endif
#if SEXP_USE_COMPLEX
    case SEXP_C64:
      sexp_flonum_value_set(f, ((float*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((float*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((float*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
    case SEXP_C128:
      sexp_flonum_value_set(f, ((double*)str)[i*2]);
      sexp_write(ctx, f, out);
      if (((double*)str)[i*2 + 1] >= 0)
        sexp_write_char(ctx, '+', out);
      sexp_flonum_value_set(f, ((double*)str)[i*2 + 1]);
      sexp_write(ctx, f, out);
      sexp_write_char(ctx, 'i', out);
      break;
#endif
    }
  }
  sexp_write_char(ctx, ')', out);
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}